

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvref_common.c
# Opt level: O0

uint8_t av1_selectSamples(MV *mv,int *pts,int *pts_inref,int len,BLOCK_SIZE bsize)

{
  int iVar1;
  int iVar2;
  int in_ECX;
  int iVar3;
  long in_RDX;
  long in_RSI;
  short *in_RDI;
  byte in_R8B;
  int diff;
  int i;
  uint8_t ret;
  int thresh;
  int bh;
  int bw;
  uint local_3c;
  uint local_34;
  byte local_2d;
  
  local_3c = (uint)block_size_high[in_R8B];
  if (local_3c < block_size_wide[in_R8B]) {
    local_3c = (uint)block_size_wide[in_R8B];
  }
  iVar1 = clamp(local_3c,0x10,0x70);
  local_2d = 0;
  for (local_34 = 0; (int)local_34 < in_ECX; local_34 = local_34 + 1) {
    iVar2 = (*(int *)(in_RDX + (long)(int)(local_34 << 1) * 4) -
            *(int *)(in_RSI + (long)(int)(local_34 << 1) * 4)) - (int)in_RDI[1];
    if (iVar2 < 1) {
      iVar2 = -iVar2;
    }
    iVar3 = (*(int *)(in_RDX + (long)(int)(local_34 * 2 + 1) * 4) -
            *(int *)(in_RSI + (long)(int)(local_34 * 2 + 1) * 4)) - (int)*in_RDI;
    if (iVar3 < 1) {
      iVar3 = -iVar3;
    }
    if (iVar2 + iVar3 <= iVar1) {
      if (local_2d != local_34) {
        *(undefined8 *)(in_RSI + (long)(int)((uint)local_2d << 1) * 4) =
             *(undefined8 *)(in_RSI + (long)(int)(local_34 << 1) * 4);
        *(undefined8 *)(in_RDX + (long)(int)((uint)local_2d << 1) * 4) =
             *(undefined8 *)(in_RDX + (long)(int)(local_34 << 1) * 4);
      }
      local_2d = local_2d + 1;
    }
  }
  if (local_2d < 2) {
    local_2d = 1;
  }
  return local_2d;
}

Assistant:

uint8_t av1_selectSamples(MV *mv, int *pts, int *pts_inref, int len,
                          BLOCK_SIZE bsize) {
  const int bw = block_size_wide[bsize];
  const int bh = block_size_high[bsize];
  const int thresh = clamp(AOMMAX(bw, bh), 16, 112);
  uint8_t ret = 0;
  assert(len <= LEAST_SQUARES_SAMPLES_MAX);

  // Only keep the samples with MV differences within threshold.
  for (int i = 0; i < len; ++i) {
    const int diff = abs(pts_inref[2 * i] - pts[2 * i] - mv->col) +
                     abs(pts_inref[2 * i + 1] - pts[2 * i + 1] - mv->row);
    if (diff > thresh) continue;
    if (ret != i) {
      memcpy(pts + 2 * ret, pts + 2 * i, 2 * sizeof(pts[0]));
      memcpy(pts_inref + 2 * ret, pts_inref + 2 * i, 2 * sizeof(pts_inref[0]));
    }
    ++ret;
  }
  // Keep at least 1 sample.
  return AOMMAX(ret, 1);
}